

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_astDataType * reduce_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  int iVar1;
  MOJOSHADER_astDataType *pMVar2;
  void *value;
  void *local_20;
  
  if (dt == (MOJOSHADER_astDataType *)0x0) {
    dt = (MOJOSHADER_astDataType *)0x0;
  }
  else if (dt->type == MOJOSHADER_AST_DATATYPE_USER) {
    pMVar2 = dt;
    do {
      dt = (pMVar2->array).base;
      if (dt->type == MOJOSHADER_AST_DATATYPE_NONE) {
        iVar1 = hash_find((ctx->usertypes).hash,(pMVar2->user).name,&local_20);
        if ((iVar1 == 0) || (local_20 == (void *)0x0)) {
          (pMVar2->array).base = (MOJOSHADER_astDataType *)0x0;
LAB_00143dd5:
          __assert_fail("user->details != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x74c,
                        "const MOJOSHADER_astDataType *reduce_datatype(Context *, const MOJOSHADER_astDataType *)"
                       );
        }
        dt = *(MOJOSHADER_astDataType **)((long)local_20 + 8);
        (pMVar2->array).base = dt;
        if (dt == (MOJOSHADER_astDataType *)0x0) goto LAB_00143dd5;
      }
      pMVar2 = dt;
    } while (dt->type == MOJOSHADER_AST_DATATYPE_USER);
  }
  return dt;
}

Assistant:

static const MOJOSHADER_astDataType *reduce_datatype(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    const MOJOSHADER_astDataType *retval = dt;
    while (retval && retval->type == MOJOSHADER_AST_DATATYPE_USER)
    {
        // !!! FIXME: Ugh, const removal.
        MOJOSHADER_astDataTypeUser *user = (MOJOSHADER_astDataTypeUser *) &retval->user;
        if (user->details->type == MOJOSHADER_AST_DATATYPE_NONE)
        {
            // Take this opportunity to fix up some usertype stubs that were
            //  left over from the parse phase. You HAVE to catch these in the
            //  right scope, so be aggressive about calling reduce_datatype()
            //  as soon as things come into view!
            user->details = get_usertype(ctx, user->name);
            assert(user->details != NULL);
        } // if

        retval = user->details;
    } // while

    return retval;
}